

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseLoop(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  size_t sVar3;
  size_t sVar4;
  byte bVar5;
  bool bVar6;
  SymbolList *pSVar7;
  Opcode OVar8;
  ValueType VVar9;
  size_t *psVar10;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String name;
  undefined1 local_90 [40];
  String local_68;
  SymbolType local_48 [6];
  
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  bVar5 = this->m_error;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if ((((bool)bVar5 == false) &&
      (pSVar2 = (this->m_currentSymbol)._M_current,
      pSVar2 != (this->m_symbolList->
                super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                _M_impl.super__Vector_impl_data._M_finish)) && (pSVar2->type == NameValue)) {
    local_48[0] = From;
    local_48[1] = Over;
    local_48[2] = Until;
    local_48[3] = While;
    symbols._M_len = 4;
    symbols._M_array = local_48;
    ParseMultiName_abi_cxx11_((String *)local_90,this,symbols);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (&local_68,
               (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_90);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      MemFree((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    bVar6 = VariableStackFrame::VariableExists(&this->m_variableStackFrame,&local_68);
    if (bVar6) {
      local_90._0_8_ = local_68._M_dataplus._M_p;
      Error<char_const*>(this,"Variable name \'%s\' already exists in this scope",(char **)local_90)
      ;
      goto LAB_001260c2;
    }
    bVar5 = this->m_error;
  }
  if ((bVar5 & 1) == 0) {
    pSVar7 = this->m_symbolList;
    pSVar2 = (this->m_currentSymbol)._M_current;
    if (pSVar2 != (pSVar7->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2->type == From) {
        this->m_lastLine = pSVar2->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar2 + 1;
        ScopeBegin(this);
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        if (local_68._M_string_length != 0) {
          VariableAssign(this,&local_68);
          EmitOpcode(this,SetVar);
          local_90._0_8_ = VariableNameToRuntimeID(this,&local_68);
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,local_90,8);
        }
        Expect(this,To,(char *)0x0);
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        if (this->m_error == false) {
          pSVar7 = this->m_symbolList;
          pSVar2 = (this->m_currentSymbol)._M_current;
          if ((pSVar2 == (pSVar7->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != By))
          goto LAB_00125e00;
          this->m_lastLine = pSVar2->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar2 + 1;
          ParseExpression(this,(pSVar7->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
        }
        else {
LAB_00125e00:
          EmitOpcode(this,PushVal);
          local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
          Variant::SetNull((Variant *)local_90);
          Variant::Write((Variant *)local_90,&this->m_writer);
          Variant::~Variant((Variant *)local_90);
        }
        Expect(this,NewLine,(char *)0x0);
        sVar4 = (this->m_writer).m_pos;
        ParseBlock(this);
        Expect(this,End,(char *)0x0);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,LoopCount);
        EmitOpcode(this,JumpTrue);
        local_90._0_4_ = (int)sVar4;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,local_90,4);
        ScopeEnd(this);
      }
      else if (pSVar2->type == Over) {
        this->m_lastLine = pSVar2->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar2 + 1;
        ScopeBegin(this);
        ParseExpression(this,(this->m_symbolList->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        bVar6 = Expect(this,NewLine,(char *)0x0);
        if (!bVar6) goto LAB_001260c2;
        EmitOpcode(this,PushTop);
        EmitOpcode(this,JumpFalse);
        psVar10 = &(this->m_writer).m_pos;
        sVar4 = (this->m_writer).m_pos;
        local_90._0_8_ = (ulong)(uint)local_90._4_4_ << 0x20;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        EmitOpcode(this,PushItr);
        if (local_68._M_string_length != 0) {
          VariableAssign(this,&local_68);
          EmitOpcode(this,SetVar);
          local_90._0_8_ = VariableNameToRuntimeID(this,&local_68);
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                        local_90,8);
        }
        sVar3 = (this->m_writer).m_pos;
        ParseBlock(this);
        Expect(this,End,(char *)0x0);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,LoopOver);
        EmitOpcode(this,JumpFalse);
        local_90._0_4_ = (ValueType)sVar3;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        sVar3 = (this->m_writer).m_pos;
        (this->m_writer).m_pos = sVar4;
        local_90._0_4_ = (int)sVar3;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        (this->m_writer).m_pos = sVar3;
        ScopeEnd(this);
      }
      else {
        if (pSVar2->type == Until) {
          VVar9 = (ValueType)(this->m_writer).m_pos;
          this->m_lastLine = pSVar2->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar2 + 1;
          OVar8 = JumpTrue;
        }
        else {
          if (pSVar2->type != While) {
            if (pSVar2->type != NewLine) goto LAB_001260b3;
            this->m_lastLine = pSVar2->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar2 + 1;
            sVar4 = (this->m_writer).m_pos;
            ParseBlock(this);
            if (this->m_error == false) {
              pSVar7 = this->m_symbolList;
              pSVar2 = (this->m_currentSymbol)._M_current;
              if ((pSVar2 == (pSVar7->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish) || (pSVar2->type != While)
                 ) goto LAB_00126176;
              this->m_lastLine = pSVar2->lineNumber;
              (this->m_currentSymbol)._M_current = pSVar2 + 1;
              OVar8 = JumpTrue;
            }
            else {
LAB_00126176:
              Expect(this,Until,(char *)0x0);
              pSVar7 = this->m_symbolList;
              OVar8 = JumpFalse;
            }
            ParseExpression(this,(pSVar7->
                                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                 )._M_impl.super__Vector_impl_data._M_finish);
            Expect(this,NewLine,(char *)0x0);
            EmitOpcode(this,OVar8);
            local_90._0_4_ = (int)sVar4;
            Buffer::Write((this->m_writer).m_buffer.
                          super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &(this->m_writer).m_pos,local_90,4);
            goto LAB_00125eb6;
          }
          VVar9 = (ValueType)(this->m_writer).m_pos;
          Expect(this,While,(char *)0x0);
          pSVar7 = this->m_symbolList;
          OVar8 = JumpFalse;
        }
        psVar10 = &(this->m_writer).m_pos;
        ParseExpression(this,(pSVar7->
                             super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                             )._M_impl.super__Vector_impl_data._M_finish);
        bVar6 = Expect(this,NewLine,(char *)0x0);
        if (!bVar6) goto LAB_001260c2;
        EmitOpcode(this,OVar8);
        sVar4 = (this->m_writer).m_pos;
        local_90._0_8_ = local_90._0_8_ & 0xffffffff00000000;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        ParseBlock(this);
        Expect(this,End,(char *)0x0);
        Expect(this,NewLine,(char *)0x0);
        EmitOpcode(this,Jump);
        local_90._0_4_ = VVar9;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        sVar3 = (this->m_writer).m_pos;
        (this->m_writer).m_pos = sVar4;
        local_90._0_4_ = (int)sVar3;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,psVar10,
                      local_90,4);
        *psVar10 = sVar3;
      }
LAB_00125eb6:
      if (this->m_breakAddress != 0) {
        sVar4 = (this->m_writer).m_pos;
        (this->m_writer).m_pos = this->m_breakAddress;
        local_90._0_4_ = (int)sVar4;
        Buffer::Write((this->m_writer).m_buffer.
                      super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &(this->m_writer).m_pos,local_90,4);
        (this->m_writer).m_pos = sVar4;
        this->m_breakAddress = 0;
      }
      goto LAB_001260c2;
    }
  }
LAB_001260b3:
  Error<>(this,"Unknown syntax after loop keyword");
LAB_001260c2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    MemFree(local_68._M_dataplus._M_p,
            CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,local_68.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Parser::ParseLoop()
	{
		// Check to see if we're using an explicitly named variable for the loop counter
		String name;
		if (CheckName())
		{
			// Parse initial name part
			name = ParseMultiName({ SymbolType::From, SymbolType::Over, SymbolType::Until, SymbolType::While });

			// Make sure the variable name doesn't already exist
			if (VariableExists(name))
			{
				Error("Variable name '%s' already exists in this scope", name.c_str());
				return;
			}
		}

		// We're looping using a counter
		if (Accept(SymbolType::From))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse from value
			ParseExpression();

			// Assign the counter to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Parse to value
			Expect(SymbolType::To);
			ParseExpression();

			// Parse increment amount
			if (Accept(SymbolType::By))
			{
				ParseExpression();
			}
			else
			{
				EmitOpcode(Opcode::PushVal);
				EmitValue(nullptr);
			}
			Expect(SymbolType::NewLine);

			// Mark where the loop count evaluation has to jump
			auto loopBeginAddress = m_writer.Tell();

			// Evaluate code block inside loop
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Advance counter and evaluate
			EmitOpcode(Opcode::LoopCount);

			// Evaluate result of loop count instruction
			EmitOpcode(Opcode::JumpTrue);
			EmitAddress(loopBeginAddress);

			// End loop scope
			ScopeEnd();
		}
		// We're looping over a collection
		else if (Accept(SymbolType::Over))
		{
			// Begin scope for loop control variables
			ScopeBegin();

			// Parse the collection
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Check to see if the collection is empty, and if so, skip the loop
			EmitOpcode(Opcode::PushTop);
			EmitOpcode(Opcode::JumpFalse);
			auto emptyLoopJumpAddress = EmitAddressPlaceholder();

			// Retrieve collection from top of stack and push iterator from beginning position
			EmitOpcode(Opcode::PushItr);

			// Assign the iterator to a variable name if it exists
			if (!name.empty())
			{
				VariableAssign(name);
				EmitOpcode(Opcode::SetVar);
				EmitId(VariableNameToRuntimeID(name));
			}

			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Increment iterator and test against collection end
			EmitOpcode(Opcode::LoopOver);
			EmitOpcode(Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);

			// Backfill empty loop jump address
			EmitAddressBackfill(emptyLoopJumpAddress);

			// End loop scope
			ScopeEnd();

		}
		// Loops while a condition is true or false
		else if (Check(SymbolType::Until) || Check(SymbolType::While))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Check for keyword
			bool jumpTrue = Accept(SymbolType::Until);
			if (!jumpTrue)
				Expect(SymbolType::While);

			// Parse the expression to control the loop's jump branch
			ParseExpression();
			if (!Expect(SymbolType::NewLine))
				return;

			// Add jump instruction, making sure to store the jump address for later backfilling
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			auto loopJumpAddress = EmitAddressPlaceholder();

			// Parse the while loop block
			ParseBlock();
			Expect(SymbolType::End);
			Expect(SymbolType::NewLine);

			// Jump to top of loop
			EmitOpcode(Opcode::Jump);
			EmitAddress(loopBeginAddress);

			// Backfill loop jump target address
			EmitAddressBackfill(loopJumpAddress);
		}
		// Executes once and then loops again while a condition is true/false, depending on keyword used
		else if (Accept(SymbolType::NewLine))
		{
			// Store where the loop logic begins
			auto loopBeginAddress = m_writer.Tell();

			// Parse the until/while loop block
			ParseBlock();

			// Check the keyword is used
			bool jumpTrue = Accept(SymbolType::While);
			if (!jumpTrue)
				Expect(SymbolType::Until);

			// Parse expression used to determine if loop should execute again
			ParseExpression();
			Expect(SymbolType::NewLine);

			// Conditionally jump to top of loop
			EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);
			EmitAddress(loopBeginAddress);
		}
		else
		{
			Error("Unknown syntax after loop keyword");
			return;
		}

		// If we used a break somewhere inside the loop, backfill the address now
		if (m_breakAddress)
		{
			EmitAddressBackfill(m_breakAddress);
			m_breakAddress = 0;
		}
	}